

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::InFilter::ToExpression(InFilter *this,Expression *column)

{
  Value *pVVar1;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> this_00;
  pointer pBVar2;
  BoundConstantExpression *this_01;
  long *in_RDX;
  pointer *__ptr;
  Value *other;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  _Tuple_impl<0UL,_duckdb::BoundOperatorExpression_*,_std::default_delete<duckdb::BoundOperatorExpression>_>
  local_80;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_78;
  Value local_70;
  
  local_78._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
  this_00._M_head_impl = (BoundOperatorExpression *)operator_new(0x70);
  LogicalType::LogicalType(&local_70.type_,BOOLEAN);
  BoundOperatorExpression::BoundOperatorExpression(this_00._M_head_impl,COMPARE_IN,&local_70.type_);
  local_80.super__Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>)
       (_Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>)this_00._M_head_impl;
  LogicalType::~LogicalType(&local_70.type_);
  pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_80);
  (**(code **)(*in_RDX + 0x88))(&local_70);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&pBVar2->children,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_70);
  if ((long *)local_70.type_._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_70.type_._0_8_ + 8))();
  }
  other = (Value *)(column->super_BaseExpression).alias._M_dataplus._M_p;
  pVVar1 = (Value *)(column->super_BaseExpression).alias._M_string_length;
  if (other != pVVar1) {
    do {
      pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                             *)&local_80);
      this_01 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value(&local_70,other);
      BoundConstantExpression::BoundConstantExpression(this_01,&local_70);
      Value::~Value(&local_70);
      local_88._M_head_impl = (Expression *)this_01;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar2->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_88);
      if ((BoundConstantExpression *)local_88._M_head_impl != (BoundConstantExpression *)0x0) {
        (*(((Expression *)&(local_88._M_head_impl)->super_BaseExpression)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      other = other + 1;
    } while (other != pVVar1);
  }
  *(_Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> *)
   local_78._M_t.
   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
   super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       local_80.super__Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_78._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> InFilter::ToExpression(const Expression &column) const {
	auto result = make_uniq<BoundOperatorExpression>(ExpressionType::COMPARE_IN, LogicalType::BOOLEAN);
	result->children.push_back(column.Copy());
	for (auto &val : values) {
		result->children.push_back(make_uniq<BoundConstantExpression>(val));
	}
	return std::move(result);
}